

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_print_(lyout *out,lyd_node *root,LYD_FORMAT format,int options)

{
  LY_ERR *pLVar1;
  int options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  lyout *out_local;
  
  if (root == (lyd_node *)0x0) {
    if ((out->type == LYOUT_MEMORY) || (out->type == LYOUT_CALLBACK)) {
      ly_print(out,"");
    }
    out_local._4_4_ = 0;
  }
  else if (format == LYD_XML) {
    out_local._4_4_ = xml_print_data(out,root,options);
  }
  else if (format == LYD_JSON) {
    out_local._4_4_ = json_print_data(out,root,options);
  }
  else {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    ly_log(LY_LLERR,"Unknown output format.");
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

static int
lyd_print_(struct lyout *out, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    if (!root) {
        /* no data to print, but even empty tree is valid */
        if (out->type == LYOUT_MEMORY || out->type == LYOUT_CALLBACK) {
            ly_print(out, "");
        }
        return EXIT_SUCCESS;
    }

    switch (format) {
    case LYD_XML:
        return xml_print_data(out, root, options);
    case LYD_JSON:
        return json_print_data(out, root, options);
    default:
        LOGERR(LY_EINVAL, "Unknown output format.");
        return EXIT_FAILURE;
    }
}